

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O2

void __thiscall ktx::ValidationContext::validateCreateAndTranscode(ValidationContext *this)

{
  bool bVar1;
  _khr_df_model_e _Var2;
  int iVar3;
  khr_df_model_e model;
  IssueWarning *issue;
  undefined8 uStack_50;
  KTXTexture2 texture;
  string local_40;
  char *local_20;
  
  texture.handle_ = (ktxTexture2 *)0x0;
  iVar3 = (*this->_vptr_ValidationContext[3])(this,(ulong)((uint)this->checkGLTFBasisU * 8 + 1));
  if (this->numWarning == 0 && this->numError == 0) {
    if (iVar3 == 0) {
      bVar1 = (this->parsedColorModel).super__Optional_base<_khr_df_model_e,_true,_true>._M_payload.
              super__Optional_payload_base<_khr_df_model_e>._M_engaged;
      _Var2 = (this->parsedColorModel).super__Optional_base<_khr_df_model_e,_true,_true>._M_payload.
              super__Optional_payload_base<_khr_df_model_e>._M_payload._M_value;
      if ((bVar1 & _Var2 == KHR_DF_MODEL_ETC1S) == 0) {
        if ((bVar1 & _Var2 == KHR_DF_MODEL_UASTC) != 1) goto LAB_0018a506;
        uStack_50 = 10;
      }
      else {
        uStack_50 = 1;
      }
      iVar3 = ktxTexture2_TranscodeBasis(texture.handle_,uStack_50,0);
      if (iVar3 == 0) goto LAB_0018a506;
      toString_abi_cxx11_(&local_40,
                          (ktx *)(ulong)(this->parsedColorModel).
                                        super__Optional_base<_khr_df_model_e,_true,_true>._M_payload
                                        .super__Optional_payload_base<_khr_df_model_e>._M_payload.
                                        _M_value,model);
      local_20 = (char *)ktxErrorString(iVar3);
      error<std::__cxx11::string,char_const*>(this,&Validator::TranscodeFailure,&local_40,&local_20)
      ;
    }
    else {
      if (iVar3 == 0x11) {
        issue = &Validator::UnsupportedFeature;
        goto LAB_0018a435;
      }
      if (iVar3 == 0x13) {
        toString_abi_cxx11_(&local_40,(ktx *)(ulong)(this->header).supercompressionScheme,
                            KTX_SS_BEGIN_RANGE);
        error<std::__cxx11::string>(this,&LevelIndex::UncompressedByteLengthMismatch,&local_40);
      }
      else {
        if (iVar3 != 0x14) {
          local_40._M_dataplus._M_p = (pointer)ktxErrorString(iVar3);
          fatal<char_const*>(this,&Validator::CreateFailure,(char **)&local_40);
          goto LAB_0018a506;
        }
        toString_abi_cxx11_(&local_40,(ktx *)(ulong)(this->header).supercompressionScheme,
                            KTX_SS_BEGIN_RANGE);
        error<std::__cxx11::string>(this,&Validator::DecompressChecksumError,&local_40);
      }
    }
    std::__cxx11::string::~string((string *)&local_40);
  }
  else {
    if (iVar3 != 0 || this->numError == 0) goto LAB_0018a506;
    issue = &Validator::SupportedNonConformantFile;
LAB_0018a435:
    warning<>(this,issue);
  }
LAB_0018a506:
  KTXTexture2::~KTXTexture2(&texture);
  return;
}

Assistant:

void ValidationContext::validateCreateAndTranscode() {
    KTXTexture2 texture{nullptr};
    ktxTextureCreateFlags flags = KTX_TEXTURE_CREATE_LOAD_IMAGE_DATA_BIT;

    if (checkGLTFBasisU)
        flags |= KTX_TEXTURE_CREATE_CHECK_GLTF_BASISU_BIT;

    ktx_error_code_e result = createKTXTexture(flags, texture.pHandle());

    if (numError == 0 && numWarning == 0) {
        switch (result) {
        case KTX_UNSUPPORTED_FEATURE:
            warning(Validator::UnsupportedFeature);
            break;

        case KTX_DECOMPRESS_LENGTH_ERROR:
            error(LevelIndex::UncompressedByteLengthMismatch,
                    toString(ktxSupercmpScheme(header.supercompressionScheme)));
            break;

        case KTX_DECOMPRESS_CHECKSUM_ERROR:
            error(Validator::DecompressChecksumError,
                    toString(ktxSupercmpScheme(header.supercompressionScheme)));
            break;

        case KTX_SUCCESS:
            if (parsedColorModel == KHR_DF_MODEL_ETC1S)
                result = ktxTexture2_TranscodeBasis(texture.handle(), KTX_TTF_ETC2_RGBA, 0);
            else if (parsedColorModel == KHR_DF_MODEL_UASTC)
                result = ktxTexture2_TranscodeBasis(texture.handle(), KTX_TTF_ASTC_4x4_RGBA, 0);

            if (result != KTX_SUCCESS)
                error(Validator::TranscodeFailure, toString(*parsedColorModel), ktxErrorString(result));
            break;

        default:
            fatal(Validator::CreateFailure, ktxErrorString(result));
            break;
        }
    } else if (result == KTX_SUCCESS && numError != 0) {
        warning(Validator::SupportedNonConformantFile);
    }
}